

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_GEOM pRVar2;
  REF_INT *pRVar3;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  REF_STATUS RVar6;
  FILE *pFVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  REF_INT RVar11;
  int iVar12;
  REF_CELL ref_cell;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  REF_DICT ref_dict;
  REF_DBL ks;
  REF_DBL kr;
  REF_INT local;
  REF_INT nodes [27];
  uint local_134;
  REF_DICT local_130;
  FILE *local_128;
  REF_DBL local_120;
  REF_DBL local_118;
  uint local_110;
  uint local_108;
  int local_104;
  REF_GRID local_100;
  REF_DBL local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  REF_DBL local_d8 [4];
  REF_CELL local_b8;
  REF_NODE local_b0;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_grid->geom;
  local_100 = ref_grid;
  pFVar7 = fopen(filename,"w");
  if (pFVar7 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe35,
           "ref_geom_curve_tec","unable to open file");
    RVar6 = 2;
  }
  else {
    fwrite("title=\"refine cad coupling in tecplot format\"\n",0x2e,1,pFVar7);
    fwrite("variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" \"ks\" \"sx\" \"sy\" \"sz\"\n"
           ,0x40,1,pFVar7);
    lVar8 = (long)pRVar2->max;
    if (lVar8 < 1) {
      uVar13 = 0x80000000;
      uVar16 = 0x7fffffff;
    }
    else {
      pRVar3 = pRVar2->descr;
      uVar16 = 0x7fffffff;
      uVar13 = 0x80000000;
      lVar9 = 0;
      do {
        if (*(int *)((long)pRVar3 + lVar9) == 2) {
          uVar1 = *(uint *)((long)pRVar3 + lVar9 + 4);
          if ((int)uVar1 <= (int)uVar16) {
            uVar16 = uVar1;
          }
          if ((int)uVar13 <= (int)uVar1) {
            uVar13 = uVar1;
          }
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar8 * 0x18 != lVar9);
    }
    if ((int)uVar16 <= (int)uVar13) {
      do {
        local_108 = uVar13;
        local_128 = pFVar7;
        pRVar4 = local_100->node;
        ref_cell = local_100->cell[3];
        pRVar2 = local_100->geom;
        local_118 = 0.0;
        local_f8 = 0.0;
        uStack_f0 = 0;
        local_e8 = 0;
        local_120 = 0.0;
        local_d8[0] = 0.0;
        local_d8[1] = 0.0;
        local_d8[2] = 0.0;
        local_134 = ref_dict_create(&local_130);
        if (local_134 == 0) {
          local_b0 = pRVar4;
          if (0 < pRVar2->max) {
            lVar9 = 0;
            lVar8 = 0;
            do {
              pRVar3 = pRVar2->descr;
              if ((*(int *)((long)pRVar3 + lVar9) == 2) &&
                 (*(uint *)((long)pRVar3 + lVar9 + 4) == uVar16)) {
                local_134 = ref_dict_store(local_130,*(REF_INT *)((long)pRVar3 + lVar9 + 0x14),
                                           (REF_INT)lVar8);
                if (local_134 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xdb9,"ref_geom_curve_tec_zone",(ulong)local_134,"mark nodes");
                  goto LAB_0013e553;
                }
              }
              lVar8 = lVar8 + 1;
              lVar9 = lVar9 + 0x18;
            } while (lVar8 < pRVar2->max);
          }
          local_110 = local_130->n;
          if (ref_cell->max < 1) {
            uVar15 = 0;
          }
          else {
            RVar11 = 0;
            uVar15 = 0;
            do {
              RVar6 = ref_cell_nodes(ref_cell,RVar11,local_a8);
              uVar15 = (ulong)((int)uVar15 + (uint)(local_a8[3] == uVar16 && RVar6 == 0));
              RVar11 = RVar11 + 1;
            } while (RVar11 < ref_cell->max);
          }
          if ((local_110 == 0) || ((int)uVar15 == 0)) {
            local_134 = ref_dict_free(local_130);
            if (local_134 != 0) {
              uVar10 = 0xdc7;
              goto LAB_0013e9bb;
            }
          }
          else {
            fprintf(local_128,
                    "zone t=\"curve%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)uVar16,(ulong)local_110,uVar15,"point","fetriangle");
            if (0 < local_130->n) {
              iVar12 = *local_130->key;
              RVar11 = *local_130->value;
              lVar8 = 1;
              local_b8 = ref_cell;
              do {
                if ((pRVar2->model != (void *)0x0) &&
                   (local_134 = ref_egads_face_curvature
                                          (pRVar2,RVar11,&local_118,&local_f8,&local_120,local_d8),
                   ref_cell = local_b8, local_134 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xdd2,"ref_geom_curve_tec_zone",(ulong)local_134,"curve");
                  goto LAB_0013e553;
                }
                if ((pRVar2->meshlink != (void *)0x0) &&
                   (local_134 = ref_meshlink_face_curvature
                                          (local_100,RVar11,&local_118,&local_f8,&local_120,local_d8
                                          ), local_134 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xdd5,"ref_geom_curve_tec_zone",(ulong)local_134,"curve");
                  goto LAB_0013e553;
                }
                pRVar5 = local_b0->real;
                lVar9 = (long)(iVar12 * 0xf);
                fprintf(local_128,
                        " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                        SUB84(pRVar5[lVar9],0),pRVar5[lVar9 + 1],pRVar5[lVar9 + 2],local_118,
                        local_f8,uStack_f0,local_e8,local_120);
                RVar11 = -1;
                iVar12 = -1;
                if (lVar8 < local_130->n) {
                  iVar12 = local_130->key[lVar8];
                  RVar11 = local_130->value[lVar8];
                }
                bVar17 = lVar8 < local_130->n;
                lVar8 = lVar8 + 1;
              } while (bVar17);
            }
            pFVar7 = local_128;
            if (0 < ref_cell->max) {
              iVar12 = 0;
              do {
                RVar6 = ref_cell_nodes(ref_cell,iVar12,local_a8);
                if ((RVar6 == 0) && (local_a8[3] == uVar16)) {
                  lVar8 = 0;
                  do {
                    local_134 = ref_dict_location(local_130,local_a8[lVar8],&local_104);
                    if (local_134 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xde2,"ref_geom_curve_tec_zone",(ulong)local_134,"localize");
                      goto LAB_0013e553;
                    }
                    fprintf(pFVar7," %d",(ulong)(local_104 + 1));
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 3);
                  fputc(10,pFVar7);
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 < ref_cell->max);
            }
            local_134 = ref_dict_free(local_130);
            if (local_134 != 0) {
              uVar10 = 0xde9;
LAB_0013e9bb:
              pcVar14 = "free dict";
              goto LAB_0013e54c;
            }
          }
          local_134 = 0;
        }
        else {
          uVar10 = 0xdb4;
          pcVar14 = "create dict";
LAB_0013e54c:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar10,"ref_geom_curve_tec_zone",(ulong)local_134,pcVar14);
        }
LAB_0013e553:
        if (local_134 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xe44,"ref_geom_curve_tec",(ulong)local_134,"tec face");
          return local_134;
        }
        bVar17 = uVar16 != local_108;
        pFVar7 = local_128;
        uVar16 = uVar16 + 1;
        uVar13 = local_108;
      } while (bVar17);
    }
    fclose(pFVar7);
    RVar6 = 0;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(file,
          "variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" "
          "\"ks\" \"sx\" \"sy\" \"sz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_curve_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}